

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_case_name,string *a_name,char *a_type_param,
          char *a_value_param,TypeId fixture_class_id,TestFactoryBase *factory)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator<char> local_3a;
  allocator<char> local_39;
  string *local_38;
  
  std::__cxx11::string::string((string *)this,(string *)a_test_case_name);
  local_38 = &this->name_;
  std::__cxx11::string::string((string *)local_38,(string *)a_name);
  if (a_type_param == (char *)0x0) {
    (this->type_param_).ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)pbVar1,a_type_param,&local_39);
    (this->type_param_).ptr_ = pbVar1;
  }
  if (a_value_param == (char *)0x0) {
    (this->value_param_).ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)pbVar1,a_value_param,&local_3a);
    (this->value_param_).ptr_ = pbVar1;
  }
  this->fixture_class_id_ = fixture_class_id;
  this->should_run_ = false;
  this->is_disabled_ = false;
  this->matches_filter_ = false;
  this->factory_ = factory;
  TestResult::TestResult(&this->result_);
  return;
}

Assistant:

TestInfo::TestInfo(const std::string& a_test_case_name,
                   const std::string& a_name,
                   const char* a_type_param,
                   const char* a_value_param,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_case_name_(a_test_case_name),
      name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      value_param_(a_value_param ? new std::string(a_value_param) : NULL),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      factory_(factory),
      result_() {}